

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O2

void Fxch_CubesUnGruping(Fxch_Man_t *pFxchMan)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int Entry;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  int Entry_00;
  int Entry_01;
  ulong uVar7;
  int i;
  int iVar8;
  long lVar9;
  int i_00;
  uint uVar10;
  Vec_Wec_t *pVVar11;
  
  pVVar11 = pFxchMan->vCubes;
  iVar1 = pVVar11->nSize;
  if (iVar1 != pFxchMan->vOutputID->nSize / pFxchMan->nSizeOutputID) {
    __assert_fail("Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID )"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/Fxch.c"
                  ,0x71,"void Fxch_CubesUnGruping(Fxch_Man_t *)");
  }
  i_00 = 0;
  do {
    if (iVar1 <= i_00) {
      Vec_IntFree(pFxchMan->vTranslation);
      Vec_IntFree(pFxchMan->vOutputID);
      if (pFxchMan->pTempOutputID != (int *)0x0) {
        free(pFxchMan->pTempOutputID);
        pFxchMan->pTempOutputID = (int *)0x0;
      }
      return;
    }
    p = Vec_WecEntry(pVVar11,i_00);
    if (p->nSize != 0) {
      iVar1 = Vec_IntEntry(p,0);
      if (iVar1 == 0) {
        piVar4 = Vec_IntEntryP(pFxchMan->vOutputID,pFxchMan->nSizeOutputID * i_00);
        uVar2 = pFxchMan->nSizeOutputID;
        uVar6 = 0;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        iVar1 = 0;
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          uVar10 = ((uint)piVar4[uVar6] >> 1 & 0x55555555) + (piVar4[uVar6] & 0x55555555U);
          uVar10 = (uVar10 >> 2 & 0x33333333) + (uVar10 & 0x33333333);
          uVar10 = (uVar10 >> 4 & 0x7070707) + (uVar10 & 0x7070707);
          uVar10 = (uVar10 >> 8 & 0xf000f) + (uVar10 & 0xf000f);
          iVar1 = (uVar10 >> 0x10) + iVar1 + (uVar10 & 0xffff);
        }
        lVar9 = 0;
        while ((lVar9 < (int)uVar2 && (iVar1 != 0))) {
          uVar2 = (int)lVar9 << 5;
          uVar10 = 0;
          while ((uVar10 < 0x20 && (iVar1 != 0))) {
            if (((uint)piVar4[lVar9] >> (uVar10 & 0x1f) & 1) != 0) {
              if (iVar1 == 1) {
                iVar3 = Vec_IntEntry(pFxchMan->vTranslation,uVar10 | uVar2);
                Vec_IntWriteEntry(p,iVar3,Entry_00);
              }
              else {
                pVVar11 = pFxchMan->vCubes;
                iVar3 = pVVar11->nSize;
                if (iVar3 == pVVar11->nCap) {
                  uVar6 = (ulong)(uint)(iVar3 * 2);
                  if (iVar3 < 0x10) {
                    uVar6 = 0x10;
                  }
                  iVar8 = (int)uVar6;
                  if (iVar3 < iVar8) {
                    if (pVVar11->pArray == (Vec_Int_t *)0x0) {
                      pVVar5 = (Vec_Int_t *)malloc(uVar6 << 4);
                    }
                    else {
                      pVVar5 = (Vec_Int_t *)realloc(pVVar11->pArray,uVar6 << 4);
                      iVar3 = pVVar11->nCap;
                    }
                    pVVar11->pArray = pVVar5;
                    memset(pVVar5 + iVar3,0,(long)(iVar8 - iVar3) << 4);
                    pVVar11->nCap = iVar8;
                    iVar3 = pVVar11->nSize;
                  }
                }
                pVVar11->nSize = iVar3 + 1U;
                if (iVar3 < 0) {
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                                ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
                }
                pVVar5 = pVVar11->pArray;
                for (iVar8 = 0; iVar8 < p->nSize; iVar8 = iVar8 + 1) {
                  Entry = Vec_IntEntry(p,iVar8);
                  Vec_IntPush(pVVar5 + ((ulong)(iVar3 + 1U) - 1),Entry);
                }
                iVar8 = Vec_IntEntry(pFxchMan->vTranslation,uVar10 | uVar2);
                Vec_IntWriteEntry(pVVar5 + ((ulong)(iVar3 + 1U) - 1),iVar8,Entry_01);
              }
              iVar1 = iVar1 + -1;
            }
            uVar10 = uVar10 + 1;
          }
          lVar9 = lVar9 + 1;
          uVar2 = pFxchMan->nSizeOutputID;
        }
      }
    }
    i_00 = i_00 + 1;
    pVVar11 = pFxchMan->vCubes;
    iVar1 = pVVar11->nSize;
  } while( true );
}

Assistant:

void Fxch_CubesUnGruping(Fxch_Man_t* pFxchMan)
{
    int iCube;
    int i, j;
    Vec_Int_t* vCube;
    Vec_Int_t* vNewCube;

    assert( Vec_WecSize( pFxchMan->vCubes ) == ( Vec_IntSize( pFxchMan->vOutputID ) / pFxchMan->nSizeOutputID ) );
    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        int * pOutputID, nOnes;
        if ( Vec_IntSize( vCube ) == 0 || Vec_IntEntry( vCube, 0 ) != 0 )
            continue;

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( i = 0; i < pFxchMan->nSizeOutputID; i++ )
            nOnes += Fxch_CountOnes( (unsigned int) pOutputID[i] );

        for ( i = 0; i < pFxchMan->nSizeOutputID && nOnes; i++ )
            for ( j = 0; j < 32 && nOnes; j++ )
                if ( pOutputID[i] & ( 1 << j ) )
                {
                    if ( nOnes == 1 )
                        Vec_IntWriteEntry( vCube, 0, Vec_IntEntry( pFxchMan->vTranslation, ( i << 5 ) | j ) );
                    else
                    {
                        vNewCube = Vec_WecPushLevel( pFxchMan->vCubes );
                        Vec_IntAppend( vNewCube, vCube );
                        Vec_IntWriteEntry( vNewCube, 0, Vec_IntEntry( pFxchMan->vTranslation, (i << 5 ) | j ) );
                    }
                    nOnes -= 1;
                }
    }

    Vec_IntFree( pFxchMan->vTranslation );
    Vec_IntFree( pFxchMan->vOutputID );
    ABC_FREE( pFxchMan->pTempOutputID );
    return;
}